

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  realtype in_RDX;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  N_Vector in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,(ARKodeMem *)in_stack_ffffffffffffffc8,
                       (ARKodeMRIStepMem *)0x1156c2c);
  if (local_4 == 0) {
    N_VLinearSum(in_RDX,(N_Vector)(ulong)in_stack_ffffffffffffffd8,
                 (realtype)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(N_Vector)0x1156c63);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepComputeState(void *arkode_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepComputeState",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return(ARK_SUCCESS);
}